

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalNinjaGenerator.cxx
# Opt level: O0

void __thiscall
cmLocalNinjaGenerator::WriteNinjaFilesInclusion(cmLocalNinjaGenerator *this,ostream *os)

{
  char *pcVar1;
  ostream *poVar2;
  cmGlobalNinjaGenerator *this_00;
  allocator local_d9;
  string local_d8;
  string local_b8;
  undefined1 local_98 [8];
  string rulesFilePath;
  allocator local_61;
  string local_60;
  undefined1 local_40 [8];
  string ninjaRulesFile;
  cmGlobalNinjaGenerator *ng;
  ostream *os_local;
  cmLocalNinjaGenerator *this_local;
  
  cmGlobalNinjaGenerator::WriteDivider(os);
  poVar2 = std::operator<<(os,"# Include auxiliary files.\n");
  std::operator<<(poVar2,"\n");
  this_00 = GetGlobalNinjaGenerator(this);
  pcVar1 = cmGlobalNinjaGenerator::NINJA_RULES_FILE;
  ninjaRulesFile.field_2._8_8_ = this_00;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_60,pcVar1,&local_61);
  cmGlobalNinjaGenerator::NinjaOutputPath((string *)local_40,this_00,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  cmGlobalNinjaGenerator::EncodePath
            (&local_b8,(cmGlobalNinjaGenerator *)ninjaRulesFile.field_2._8_8_,(string *)local_40);
  cmGlobalNinjaGenerator::EncodeIdent((string *)local_98,&local_b8,os);
  std::__cxx11::string::~string((string *)&local_b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_d8,"Include rules file.",&local_d9);
  cmGlobalNinjaGenerator::WriteInclude(os,(string *)local_98,&local_d8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_d9);
  std::operator<<(os,"\n");
  std::__cxx11::string::~string((string *)local_98);
  std::__cxx11::string::~string((string *)local_40);
  return;
}

Assistant:

void cmLocalNinjaGenerator::WriteNinjaFilesInclusion(std::ostream& os)
{
  cmGlobalNinjaGenerator::WriteDivider(os);
  os << "# Include auxiliary files.\n"
     << "\n";
  cmGlobalNinjaGenerator* ng = this->GetGlobalNinjaGenerator();
  std::string const ninjaRulesFile =
    ng->NinjaOutputPath(cmGlobalNinjaGenerator::NINJA_RULES_FILE);
  std::string const rulesFilePath =
    ng->EncodeIdent(ng->EncodePath(ninjaRulesFile), os);
  cmGlobalNinjaGenerator::WriteInclude(os, rulesFilePath,
                                       "Include rules file.");
  os << "\n";
}